

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<6ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                *matchers,tuple<int,_int,_int,_int,_int,_int,_int> *values,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  _Head_base<5UL,_int,_false> *x;
  MatcherBase<int> *this;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<5ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
            (matchers,values,os);
  this = (MatcherBase<int> *)
         &(matchers->
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
          ).
          super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .
          super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .
          super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .
          super__Tuple_impl<4UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Tuple_impl<5UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
          super__Head_base<5UL,_testing::Matcher<int>,_false>;
  Matcher<int>::Matcher(&matcher,(Matcher<int> *)this);
  StringMatchResultListener::StringMatchResultListener(&listener);
  x = &(values->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int>).
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int,_int,_int>.super__Tuple_impl<3UL,_int,_int,_int,_int>.
       super__Tuple_impl<4UL,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int>.
       super__Head_base<5UL,_int,_false>;
  bVar1 = MatcherBase<int>::MatchAndExplain
                    (&matcher.super_MatcherBase<int>,&x->_M_head_impl,
                     &listener.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<int>::DescribeTo(this,os);
    std::operator<<(os,"\n           Actual: ");
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(&x->_M_head_impl,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<int>::~MatcherBase(&matcher.super_MatcherBase<int>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }